

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pztrigraph.cpp
# Opt level: O0

int __thiscall TPZGraphElT::NPoints(TPZGraphElT *this,TPZGraphNode *n)

{
  int iVar1;
  uint uVar2;
  TPZGraphEl *in_RSI;
  long in_RDI;
  int in;
  int imax;
  int res;
  undefined4 local_4;
  
  iVar1 = TPZGraphMesh::Res(*(TPZGraphMesh **)(in_RDI + 0x10));
  local_4 = 1 << ((byte)iVar1 & 0x1f);
  uVar2 = TPZGraphEl::ConnectNum(in_RSI,(TPZGraphNode *)CONCAT44(iVar1,local_4));
  if (uVar2 < 3) {
    local_4 = 1;
  }
  else if (uVar2 - 3 < 3) {
    local_4 = local_4 + -1;
  }
  else if (uVar2 == 6) {
    local_4 = ((local_4 + -1) * (local_4 + -2)) / 2;
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int TPZGraphElT::NPoints(TPZGraphNode *n){
	int res = fGraphMesh->Res();
	int imax = (1<<res);                                                                       
	int in = ConnectNum(n);
	switch(in) {
		case 0:
		case 1:
		case 2:
			return 1;
		case 3:
		case 4:
		case 5:
			return imax-1;
		case 6:
			return ((imax-1)*(imax-2))/2;
	}
	return 1;
}